

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_temporary_files.cpp
# Opt level: O2

void duckdb::DuckDBTemporaryFilesFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  GlobalTableFunctionState *pGVar1;
  reference pvVar2;
  long value;
  _func_int **pp_Var3;
  _func_int **__n;
  _func_int **pp_Var4;
  ulong index;
  string local_90;
  Value local_70;
  
  pGVar1 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  __n = pGVar1[4]._vptr_GlobalTableFunctionState;
  pp_Var4 = pGVar1[1]._vptr_GlobalTableFunctionState;
  pp_Var3 = pGVar1[2]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)(((long)pp_Var3 - (long)pp_Var4) / 0x28)) {
    for (index = 0;
        (__n < (_func_int **)(((long)pp_Var3 - (long)pp_Var4) / 0x28) && (index < 0x800));
        index = index + 1) {
      pGVar1[4]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
      pvVar2 = vector<duckdb::TemporaryFileInformation,_true>::get<true>
                         ((vector<duckdb::TemporaryFileInformation,_true> *)(pGVar1 + 1),
                          (size_type)__n);
      ::std::__cxx11::string::string((string *)&local_90,(string *)pvVar2);
      Value::Value(&local_70,&local_90);
      DataChunk::SetValue(output,0,index,&local_70);
      Value::~Value(&local_70);
      ::std::__cxx11::string::~string((string *)&local_90);
      value = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar2->size);
      Value::BIGINT(&local_70,value);
      DataChunk::SetValue(output,1,index,&local_70);
      Value::~Value(&local_70);
      __n = pGVar1[4]._vptr_GlobalTableFunctionState;
      pp_Var4 = pGVar1[1]._vptr_GlobalTableFunctionState;
      pp_Var3 = pGVar1[2]._vptr_GlobalTableFunctionState;
    }
    output->count = index;
  }
  return;
}

Assistant:

void DuckDBTemporaryFilesFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBTemporaryFilesData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset++];
		// return values:
		idx_t col = 0;
		// database_name, VARCHAR
		output.SetValue(col++, count, entry.path);
		// database_oid, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(entry.size)));
		count++;
	}
	output.SetCardinality(count);
}